

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O2

void __thiscall
afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>::
enqueue_event<vending::events::load_done>
          (state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
           *this,load_done *event)

{
  id_type *local_20;
  anon_class_16_2_20c42392 local_18;
  
  LOCK();
  (this->queue_size_).super___atomic_base<unsigned_long>._M_i =
       (this->queue_size_).super___atomic_base<unsigned_long>._M_i + 1;
  UNLOCK();
  local_20 = (id_type *)&detail::event<vending::events::load_done>::id;
  local_18.this = this;
  std::
  deque<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>>>
  ::
  emplace_back<afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>::enqueue_event<vending::events::load_done>(vending::events::load_done&&)::_lambda()_1_,afsm::detail::event_base::id_type_const*>
            ((deque<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>>>
              *)&this->queued_events_,&local_18,&local_20);
  process_event_queue(this);
  return;
}

Assistant:

void
    enqueue_event(Event&& event)
    {
        using evt_identity = typename detail::event_identity<Event>::type;
        {
            lock_guard lock{mutex_};
            ++queue_size_;
            observer_wrapper::enqueue_event(*this, ::std::forward<Event>(event));
            Event evt{::std::forward<Event>(event)};
            queued_events_.emplace_back([&, evt]() mutable {
                return process_event_dispatch(::std::move(evt));
            }, &evt_identity::id);
        }
        // Process enqueued events in case we've been waiting for queue
        // mutex release
        process_event_queue();
    }